

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epnp.cpp
# Opt level: O3

double __thiscall
opengv::absolute_pose::modules::Epnp::reprojection_error(Epnp *this,double (*R) [3],double *t)

{
  double *pdVar1;
  double *pdVar2;
  ulong *puVar3;
  int iVar4;
  long lVar5;
  double *pdVar6;
  long lVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 in_XMM23 [16];
  undefined1 auVar12 [16];
  
  iVar4 = this->number_of_correspondences;
  if ((long)iVar4 < 1) {
    dVar8 = 0.0;
  }
  else {
    auVar13._8_8_ = 0;
    auVar13._0_8_ = (*R)[0];
    auVar14._8_8_ = 0;
    auVar14._0_8_ = (*R)[1];
    auVar15._8_8_ = 0;
    auVar15._0_8_ = (*R)[2];
    auVar16._8_8_ = 0;
    auVar16._0_8_ = *t;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = t[1];
    auVar24._8_8_ = 0;
    auVar24._0_8_ = t[2];
    auVar18._8_8_ = 0;
    auVar18._0_8_ = R[1][0];
    auVar19._8_8_ = 0;
    auVar19._0_8_ = R[1][1];
    auVar20._8_8_ = 0;
    auVar20._0_8_ = R[1][2];
    auVar21._8_8_ = 0;
    auVar21._0_8_ = R[2][0];
    auVar22._8_8_ = 0;
    auVar22._0_8_ = R[2][1];
    auVar23._8_8_ = 0;
    auVar23._0_8_ = R[2][2];
    auVar25._8_8_ = 0;
    auVar25._0_8_ = this->uc;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = this->vc;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = this->fu;
    auVar12 = ZEXT816(0);
    lVar7 = 0;
    pdVar6 = this->pws + 2;
    do {
      pdVar1 = pdVar6 + -1;
      pdVar2 = pdVar6 + -2;
      dVar8 = *pdVar6;
      pdVar6 = pdVar6 + 3;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = *pdVar1;
      auVar9 = vmulsd_avx512f(auVar14,auVar10);
      auVar10 = vmulsd_avx512f(auVar10,auVar19);
      auVar31._8_8_ = 0;
      auVar31._0_8_ = *pdVar1;
      auVar11 = vmulsd_avx512f(auVar31,auVar22);
      auVar29._8_8_ = 0;
      auVar29._0_8_ = *pdVar2;
      auVar11 = vfmadd231sd_avx512f(auVar11,auVar21,auVar29);
      auVar9 = vfmadd231sd_avx512f(auVar9,auVar13,auVar29);
      auVar30._8_8_ = 0;
      auVar30._0_8_ = *pdVar2;
      auVar10 = vfmadd231sd_avx512f(auVar10,auVar18,auVar30);
      auVar33._8_8_ = 0;
      auVar33._0_8_ = dVar8;
      auVar11 = vfmadd231sd_avx512f(auVar11,auVar23,auVar33);
      auVar9 = vfmadd231sd_avx512f(auVar9,auVar15,auVar33);
      auVar34._8_8_ = 0;
      auVar34._0_8_ = dVar8;
      auVar10 = vfmadd231sd_avx512f(auVar10,auVar20,auVar34);
      auVar11 = vaddsd_avx512f(auVar24,auVar11);
      auVar9 = vaddsd_avx512f(auVar9,auVar16);
      auVar10 = vaddsd_avx512f(auVar17,auVar10);
      lVar5 = lVar7 + 8;
      auVar11 = vdivsd_avx512f(ZEXT816(0x3ff0000000000000),auVar11);
      auVar9 = vmulsd_avx512f(auVar9,auVar27);
      auVar28._8_8_ = 0;
      auVar28._0_8_ = this->fv;
      auVar10 = vmulsd_avx512f(auVar10,auVar28);
      auVar10 = vfmadd213sd_avx512f(auVar10,auVar11,auVar26);
      auVar9 = vfmadd213sd_avx512f(auVar9,auVar11,auVar25);
      puVar3 = (ulong *)((long)this->us + lVar7);
      lVar7 = lVar7 + 0x10;
      auVar32._8_8_ = 0;
      auVar32._0_8_ = *(ulong *)((long)this->us + lVar5);
      auVar10 = vsubsd_avx512f(auVar32,auVar10);
      auVar10 = vmulsd_avx512f(auVar10,auVar10);
      auVar11._8_8_ = 0;
      auVar11._0_8_ = *puVar3;
      auVar9 = vsubsd_avx512f(auVar11,auVar9);
      auVar9 = vfmadd231sd_avx512f(auVar10,auVar9,auVar9);
      auVar9 = vsqrtsd_avx512f(auVar9,auVar9);
      auVar12 = vaddsd_avx512f(auVar12,auVar9);
      dVar8 = auVar12._0_8_;
    } while ((long)iVar4 << 4 != lVar7);
  }
  auVar12 = vcvtsi2sd_avx512f(in_XMM23,iVar4);
  return dVar8 / auVar12._0_8_;
}

Assistant:

double
opengv::absolute_pose::modules::Epnp::reprojection_error(
    const double R[3][3],
    const double t[3])
{
  double sum2 = 0.0;

  for(int i = 0; i < number_of_correspondences; i++)
  {
    double * pw = pws + 3 * i;
    double Xc = dot(R[0], pw) + t[0];
    double Yc = dot(R[1], pw) + t[1];
    double inv_Zc = 1.0 / (dot(R[2], pw) + t[2]);
    double ue = uc + fu * Xc * inv_Zc;
    double ve = vc + fv * Yc * inv_Zc;
    double u = us[2 * i], v = us[2 * i + 1];

    sum2 += sqrt( (u - ue) * (u - ue) + (v - ve) * (v - ve) );
  }

  return sum2 / number_of_correspondences;
}